

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O1

SubtreeArray ts_subtree_array_remove_trailing_extras(SubtreeArray *self)

{
  SubtreeHeapData *pSVar1;
  Subtree SVar2;
  long lVar3;
  undefined8 uVar4;
  uint uVar5;
  Subtree *pSVar6;
  uint uVar7;
  int iVar8;
  long extraout_RDX;
  long lVar9;
  ulong uVar10;
  uint32_t uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  bool bVar15;
  SubtreeArray SVar16;
  SubtreeArray SVar17;
  long *local_40;
  
  uVar13 = (ulong)self->size;
  uVar11 = self->size + 1;
  pSVar6 = (Subtree *)0x0;
  uVar10 = 0;
  do {
    bVar15 = uVar13 == 0;
    uVar13 = uVar13 - 1;
    if (bVar15) {
      uVar11 = 0;
      break;
    }
    pSVar1 = self->contents[uVar13].ptr;
    if (((ulong)pSVar1 & 1) == 0) {
      uVar14 = *(uint *)&pSVar1->field_0x2c >> 2;
    }
    else {
      uVar14 = (uint)((ulong)pSVar1 >> 3) & 0x1fffffff;
    }
    if ((uVar14 & 1) != 0) {
      uVar7 = (uint)(uVar10 >> 0x20);
      if ((uint)uVar10 == uVar7) {
        uVar5 = uVar7 * 2;
        if (uVar7 * 2 < 9) {
          uVar5 = 8;
        }
        local_40 = (long *)(ulong)uVar5;
        if (uVar7 < uVar5) {
          if (pSVar6 == (Subtree *)0x0) {
            pSVar6 = (Subtree *)calloc((size_t)local_40,8);
            if (pSVar6 == (Subtree *)0x0) goto LAB_00131e64;
          }
          else {
            pSVar6 = (Subtree *)realloc(pSVar6,(size_t)((long)local_40 << 3));
            if (pSVar6 == (Subtree *)0x0) {
              ts_subtree_array_remove_trailing_extras_cold_1();
              local_40 = (long *)((long)local_40 << 3);
LAB_00131e64:
              ts_subtree_array_remove_trailing_extras_cold_2();
              pSVar6 = (Subtree *)(ulong)*(uint *)(local_40 + 1);
              lVar9 = extraout_RDX;
              if ((Subtree *)0x1 < pSVar6) {
                pSVar6 = (Subtree *)(ulong)(*(uint *)(local_40 + 1) >> 1);
                iVar8 = -1;
                lVar9 = 0;
                do {
                  uVar10 = (ulong)(uint)((int)local_40[1] + iVar8);
                  lVar3 = *local_40;
                  uVar4 = *(undefined8 *)(lVar3 + lVar9 * 8);
                  *(undefined8 *)(lVar3 + lVar9 * 8) = *(undefined8 *)(lVar3 + uVar10 * 8);
                  *(undefined8 *)(*local_40 + uVar10 * 8) = uVar4;
                  lVar9 = lVar9 + 1;
                  iVar8 = iVar8 + -1;
                } while (pSVar6 != (Subtree *)lVar9);
              }
              SVar17.size = (int)lVar9;
              SVar17.capacity = (int)((ulong)lVar9 >> 0x20);
              SVar17.contents = pSVar6;
              return SVar17;
            }
          }
          uVar10 = uVar10 & 0xffffffff | (long)local_40 << 0x20;
        }
      }
      uVar12 = uVar10 & 0xffffffff;
      uVar10 = uVar10 & 0xffffffff00000000 | (ulong)((int)uVar10 + 1);
      pSVar6[uVar12].ptr = pSVar1;
    }
    uVar11 = uVar11 - 1;
  } while ((uVar14 & 1) != 0);
  self->size = uVar11;
  if ((uVar10 & 0xfffffffe) != 0) {
    uVar12 = 0;
    uVar13 = uVar10;
    do {
      uVar13 = uVar13 - 1;
      SVar2 = pSVar6[uVar12];
      pSVar6[uVar12] = pSVar6[uVar13 & 0xffffffff];
      pSVar6[uVar13 & 0xffffffff] = SVar2;
      uVar12 = uVar12 + 1;
    } while ((uVar10 >> 1 & 0x7fffffff) != uVar12);
  }
  SVar16.size = (int)uVar10;
  SVar16.capacity = (int)(uVar10 >> 0x20);
  SVar16.contents = pSVar6;
  return SVar16;
}

Assistant:

SubtreeArray ts_subtree_array_remove_trailing_extras(SubtreeArray *self) {
  SubtreeArray result = array_new();

  uint32_t i = self->size - 1;
  for (; i + 1 > 0; i--) {
    Subtree child = self->contents[i];
    if (!ts_subtree_extra(child)) break;
    array_push(&result, child);
  }

  self->size = i + 1;
  ts_subtree_array_reverse(&result);
  return result;
}